

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O0

void sha2_256(void *key,int len,uint32_t seed,void *out)

{
  uint in_EDX;
  unsigned_long in_RDI;
  
  sha256_init((hash_state *)0x112701);
  ltc_state.sha256.state[0] = in_EDX ^ 0x6a09e667;
  sha256_process((hash_state *)CONCAT44(len,seed),(uchar *)out,in_RDI);
  sha256_done((hash_state *)CONCAT44(len,seed),(uchar *)out);
  return;
}

Assistant:

inline void sha2_256(const void *key, int len, uint32_t seed, void *out)
{
  // objsize
  sha256_init(&ltc_state);
  ltc_state.sha256.state[0] = 0x6A09E667UL ^ seed;
  sha256_process(&ltc_state, (unsigned char *)key, len);
  sha256_done(&ltc_state, (unsigned char *)out);
}